

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  time_t tVar1;
  char goGame;
  Battle battle;
  Player computer;
  Player player;
  char local_7d9;
  string local_7d8;
  string local_7b8;
  Battle local_798;
  Player local_780;
  Player local_3d8;
  
  setlocale(6,"");
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_7d9 = '0';
  do {
    UI::showMenu(&local_7d9);
    if (local_7d9 == '1') {
      Battle::Battle(&local_798);
      local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"human","");
      Player::Player(&local_3d8,&local_7b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
        operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
      }
      local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"AI","");
      Player::Player(&local_780,&local_7d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
        operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
      }
      Battle::initPlayers(&local_798,&local_3d8,&local_780);
      Battle::prepareForBattle(&local_798);
      Battle::startBattle(&local_798);
      Battle::finish(&local_798);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_780.name._M_dataplus._M_p != &local_780.name.field_2) {
        operator_delete(local_780.name._M_dataplus._M_p,
                        local_780.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8.name._M_dataplus._M_p != &local_3d8.name.field_2) {
        operator_delete(local_3d8.name._M_dataplus._M_p,
                        local_3d8.name.field_2._M_allocated_capacity + 1);
      }
    }
  } while (local_7d9 != '3');
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "");
    srand(time(NULL));
    char goGame = '0';

    while(goGame != '3')
    {
        UI::showMenu(goGame);
        if(goGame == '1')
        {
            Battle battle;

            Player player("human"), computer("AI");
            battle.initPlayers(player,computer);

            battle.prepareForBattle();
            battle.startBattle();
            battle.finish();
        }

    }

    return 0;
}